

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O2

void __thiscall IsInfinityTests::Run(IsInfinityTests *this)

{
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string(local_a8,"Is::Infinity(0.0f) is False",&local_109);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:14:39)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:14:39)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_a8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::string(local_c8,"Is::Infinity(Infinity) is True",&local_109);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:18:42)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:18:42)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_c8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::string(local_e8,"Is::Infinity is Operand",&local_109);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:23:35)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:23:35)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])(this,local_e8)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::string(local_108,"Is::Infinity has an error message",&local_109);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:27:45)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/InfinityTests.cpp:27:45)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Infinity(0.0f) is False", []() {
			AssertThat(ut11::Is::Infinity(0.0f), ut11::Is::False);
		});

		Then("Is::Infinity(Infinity) is True", []() {
			AssertThat(ut11::Is::Infinity(std::numeric_limits<float>::infinity()), ut11::Is::True);
			AssertThat(ut11::Is::Infinity(-std::numeric_limits<float>::infinity()), ut11::Is::True);
		});

		Then("Is::Infinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Infinity) >::value, ut11::Is::True);
		});

		Then("Is::Infinity has an error message", []() {
			AssertThat(ut11::Is::Infinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});
	}